

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResource.hpp
# Opt level: O0

void __thiscall tcu::ResourcePrefix::~ResourcePrefix(ResourcePrefix *this)

{
  ResourcePrefix *this_local;
  
  ~ResourcePrefix(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual						~ResourcePrefix		(void) {}